

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GenOptionalDecl_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,Type *type)

{
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Type *local_20;
  Type *type_local;
  CppGenerator *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  GenTypeBasic_abi_cxx11_(&local_60,this,type,true);
  std::operator+(&local_40,"::flatbuffers::Optional<",&local_60);
  std::operator+(__return_storage_ptr__,&local_40,">");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string GenOptionalDecl(const Type &type) {
    return "::flatbuffers::Optional<" + GenTypeBasic(type, true) + ">";
  }